

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

FieldGeneratorBase *
google::protobuf::compiler::csharp::CreateFieldGenerator
          (FieldDescriptor *descriptor,int presenceIndex,Options *options)

{
  bool bVar1;
  Type TVar2;
  OneofDescriptor *pOVar3;
  Options *options_local;
  int presenceIndex_local;
  FieldDescriptor *descriptor_local;
  
  TVar2 = FieldDescriptor::type(descriptor);
  if (TVar2 - TYPE_GROUP < 2) {
    bVar1 = FieldDescriptor::is_repeated(descriptor);
    if (bVar1) {
      bVar1 = FieldDescriptor::is_map(descriptor);
      if (bVar1) {
        descriptor_local = (FieldDescriptor *)operator_new(0x50);
        MapFieldGenerator::MapFieldGenerator
                  ((MapFieldGenerator *)descriptor_local,descriptor,presenceIndex,options);
      }
      else {
        descriptor_local = (FieldDescriptor *)operator_new(0x50);
        RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
                  ((RepeatedMessageFieldGenerator *)descriptor_local,descriptor,presenceIndex,
                   options);
      }
    }
    else {
      bVar1 = IsWrapperType(descriptor);
      if (bVar1) {
        pOVar3 = FieldDescriptor::real_containing_oneof(descriptor);
        if (pOVar3 == (OneofDescriptor *)0x0) {
          descriptor_local = (FieldDescriptor *)operator_new(0x58);
          WrapperFieldGenerator::WrapperFieldGenerator
                    ((WrapperFieldGenerator *)descriptor_local,descriptor,presenceIndex,options);
        }
        else {
          descriptor_local = (FieldDescriptor *)operator_new(0x58);
          WrapperOneofFieldGenerator::WrapperOneofFieldGenerator
                    ((WrapperOneofFieldGenerator *)descriptor_local,descriptor,presenceIndex,options
                    );
        }
      }
      else {
        pOVar3 = FieldDescriptor::real_containing_oneof(descriptor);
        if (pOVar3 == (OneofDescriptor *)0x0) {
          descriptor_local = (FieldDescriptor *)operator_new(0x50);
          MessageFieldGenerator::MessageFieldGenerator
                    ((MessageFieldGenerator *)descriptor_local,descriptor,presenceIndex,options);
        }
        else {
          descriptor_local = (FieldDescriptor *)operator_new(0x50);
          MessageOneofFieldGenerator::MessageOneofFieldGenerator
                    ((MessageOneofFieldGenerator *)descriptor_local,descriptor,presenceIndex,options
                    );
        }
      }
    }
  }
  else if (TVar2 == TYPE_ENUM) {
    bVar1 = FieldDescriptor::is_repeated(descriptor);
    if (bVar1) {
      descriptor_local = (FieldDescriptor *)operator_new(0x50);
      RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                ((RepeatedEnumFieldGenerator *)descriptor_local,descriptor,presenceIndex,options);
    }
    else {
      pOVar3 = FieldDescriptor::real_containing_oneof(descriptor);
      if (pOVar3 == (OneofDescriptor *)0x0) {
        descriptor_local = (FieldDescriptor *)operator_new(0x58);
        EnumFieldGenerator::EnumFieldGenerator
                  ((EnumFieldGenerator *)descriptor_local,descriptor,presenceIndex,options);
      }
      else {
        descriptor_local = (FieldDescriptor *)operator_new(0x58);
        EnumOneofFieldGenerator::EnumOneofFieldGenerator
                  ((EnumOneofFieldGenerator *)descriptor_local,descriptor,presenceIndex,options);
      }
    }
  }
  else {
    bVar1 = FieldDescriptor::is_repeated(descriptor);
    if (bVar1) {
      descriptor_local = (FieldDescriptor *)operator_new(0x50);
      RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
                ((RepeatedPrimitiveFieldGenerator *)descriptor_local,descriptor,presenceIndex,
                 options);
    }
    else {
      pOVar3 = FieldDescriptor::real_containing_oneof(descriptor);
      if (pOVar3 == (OneofDescriptor *)0x0) {
        descriptor_local = (FieldDescriptor *)operator_new(0x58);
        PrimitiveFieldGenerator::PrimitiveFieldGenerator
                  ((PrimitiveFieldGenerator *)descriptor_local,descriptor,presenceIndex,options);
      }
      else {
        descriptor_local = (FieldDescriptor *)operator_new(0x58);
        PrimitiveOneofFieldGenerator::PrimitiveOneofFieldGenerator
                  ((PrimitiveOneofFieldGenerator *)descriptor_local,descriptor,presenceIndex,options
                  );
      }
    }
  }
  return (FieldGeneratorBase *)descriptor_local;
}

Assistant:

FieldGeneratorBase* CreateFieldGenerator(const FieldDescriptor* descriptor,
                                         int presenceIndex,
                                         const Options* options) {
  switch (descriptor->type()) {
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
      if (descriptor->is_repeated()) {
        if (descriptor->is_map()) {
          return new MapFieldGenerator(descriptor, presenceIndex, options);
        } else {
          return new RepeatedMessageFieldGenerator(descriptor, presenceIndex, options);
        }
      } else {
        if (IsWrapperType(descriptor)) {
          if (descriptor->real_containing_oneof()) {
            return new WrapperOneofFieldGenerator(descriptor, presenceIndex, options);
          } else {
            return new WrapperFieldGenerator(descriptor, presenceIndex, options);
          }
        } else {
          if (descriptor->real_containing_oneof()) {
            return new MessageOneofFieldGenerator(descriptor, presenceIndex, options);
          } else {
            return new MessageFieldGenerator(descriptor, presenceIndex, options);
          }
        }
      }
    case FieldDescriptor::TYPE_ENUM:
      if (descriptor->is_repeated()) {
        return new RepeatedEnumFieldGenerator(descriptor, presenceIndex, options);
      } else {
        if (descriptor->real_containing_oneof()) {
          return new EnumOneofFieldGenerator(descriptor, presenceIndex, options);
        } else {
          return new EnumFieldGenerator(descriptor, presenceIndex, options);
        }
      }
    default:
      if (descriptor->is_repeated()) {
        return new RepeatedPrimitiveFieldGenerator(descriptor, presenceIndex, options);
      } else {
        if (descriptor->real_containing_oneof()) {
          return new PrimitiveOneofFieldGenerator(descriptor, presenceIndex, options);
        } else {
          return new PrimitiveFieldGenerator(descriptor, presenceIndex, options);
        }
      }
  }
}